

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cc
# Opt level: O3

string * __thiscall
flow::disassemble(string *__return_storage_ptr__,flow *this,Instruction *program,size_t n,
                 string *indent,ConstantPool *cp)

{
  string *psVar1;
  int iVar2;
  size_t ip;
  Instruction pc;
  stringstream result;
  string local_1f0;
  string *local_1d0;
  flow *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = __return_storage_ptr__;
  local_1c0 = indent;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (0 < (long)program) {
    local_1c8 = this + (long)program * 8;
    ip = 0;
    pc = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,*(char **)n,*(long *)(n + 8));
      disassemble_abi_cxx11_(&local_1f0,*(flow **)this,pc,ip,(size_t)local_1c0,cp);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,
                 (char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_)
                 ,local_1f0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
          &local_1f0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
                        local_1f0.field_2._M_allocated_capacity + 1);
      }
      local_1f0._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1f0,1);
      iVar2 = getStackChange(*(Instruction *)this);
      ip = ip + (long)iVar2;
      this = this + 8;
      pc = pc + 1;
    } while (this < local_1c8);
  }
  psVar1 = local_1d0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string disassemble(const Instruction* program,
                        size_t n,
                        const std::string& indent,
                        const ConstantPool* cp) {
  std::stringstream result;
  size_t i = 0;
  size_t sp = 0;
  for (const Instruction* pc = program; pc < program + n; ++pc) {
    result << indent;
    result << disassemble(*pc, i++, sp, cp);
    result << '\n';
    sp += getStackChange(*pc);
  }
  return result.str();
}